

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function
          (Dynamic_Object_Function *this,string *t_type_name,Proxy_Function *t_func,Type_Info *t_ti,
          bool t_is_attribute)

{
  type_info *ptVar1;
  undefined4 uVar2;
  Type_Info *pTVar3;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> _Stack_48;
  
  build_param_types((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    &_Stack_48,
                    &((t_func->
                      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->m_types,t_ti);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_48,
             ((t_func->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_arity);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&_Stack_48);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Function_004b18e0;
  std::__cxx11::string::string(&this->m_type_name,t_type_name);
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->m_func).
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ,&t_func->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              );
  if ((t_ti->m_flags & 0x20) == 0) {
    pTVar3 = (Type_Info *)operator_new(0x18);
    uVar2 = *(undefined4 *)&t_ti->field_0x14;
    pTVar3->m_flags = t_ti->m_flags;
    *(undefined4 *)&pTVar3->field_0x14 = uVar2;
    ptVar1 = t_ti->m_bare_type_info;
    pTVar3->m_type_info = t_ti->m_type_info;
    pTVar3->m_bare_type_info = ptVar1;
  }
  else {
    pTVar3 = (Type_Info *)0x0;
  }
  (this->m_ti)._M_t.
  super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>._M_t.
  super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>.
  super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl = pTVar3;
  (this->m_doti).m_type_info = (type_info *)&Dynamic_Object::typeinfo;
  (this->m_doti).m_bare_type_info = (type_info *)&Dynamic_Object::typeinfo;
  (this->m_doti).m_flags = 0;
  this->m_is_attribute = t_is_attribute;
  if (((t_func->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->m_arity != 0) {
    return;
  }
  __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                ,0x3b,
                "chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function(std::string, const Proxy_Function &, const Type_Info &, bool)"
               );
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, const Type_Info &t_ti, bool t_is_attribute = false)
            : Proxy_Function_Base(build_param_types(t_func->get_param_types(), t_ti), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_ti(t_ti.is_undef() ? nullptr : new Type_Info(t_ti))
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }